

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

_Bool al_set_shader_matrix(char *name,ALLEGRO_TRANSFORM *matrix)

{
  ALLEGRO_SHADER *pAVar1;
  ALLEGRO_BITMAP *pAVar2;
  ALLEGRO_TRANSFORM *in_RSI;
  char *in_RDI;
  ALLEGRO_SHADER *shader;
  ALLEGRO_BITMAP *bmp;
  _Bool local_1;
  
  pAVar2 = al_get_target_bitmap();
  if (pAVar2 == (ALLEGRO_BITMAP *)0x0) {
    local_1 = false;
  }
  else {
    pAVar1 = pAVar2->shader;
    if (pAVar1 == (ALLEGRO_SHADER *)0x0) {
      local_1 = false;
    }
    else {
      local_1 = (*pAVar1->vt->set_shader_matrix)(pAVar1,in_RDI,in_RSI);
    }
  }
  return local_1;
}

Assistant:

bool al_set_shader_matrix(const char *name,
   const ALLEGRO_TRANSFORM *matrix)
{
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_SHADER *shader;

   if ((bmp = al_get_target_bitmap()) != NULL) {
      if ((shader = bmp->shader) != NULL) {
         return shader->vt->set_shader_matrix(shader, name, matrix);
      }
      else {
         return false;
      }
   }
   else {
      return false;
   }
}